

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.cpp
# Opt level: O2

void __thiscall ot::commissioner::BorderAgent::BorderAgent(BorderAgent *this)

{
  allocator local_170;
  allocator local_16f;
  allocator local_16e;
  allocator local_16d;
  allocator local_16c;
  allocator local_16b;
  allocator local_16a;
  allocator local_169;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_f0,anon_var_dwarf_4dd013 + 9,&local_169);
  local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_110,anon_var_dwarf_4dd013 + 9,&local_16a);
  std::__cxx11::string::string((string *)&local_130,anon_var_dwarf_4dd013 + 9,&local_16b);
  std::__cxx11::string::string((string *)&local_50,anon_var_dwarf_4dd013 + 9,&local_16c);
  std::__cxx11::string::string((string *)&local_70,anon_var_dwarf_4dd013 + 9,&local_16d);
  std::__cxx11::string::string((string *)&local_90,anon_var_dwarf_4dd013 + 9,&local_16e);
  local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_b0,anon_var_dwarf_4dd013 + 9,&local_16f);
  std::__cxx11::string::string((string *)&local_d0,anon_var_dwarf_4dd013 + 9,&local_170);
  BorderAgent(this,&local_f0,0,(ByteArray *)&local_148,&local_110,(State)0x0,&local_130,0,&local_50,
              &local_70,(Timestamp)0x0,0,&local_90,(ByteArray *)&local_168,&local_b0,'\0',0,
              &local_d0,(UnixTime)0x0,0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_168);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_148);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

BorderAgent::BorderAgent()
    : BorderAgent{
          "", 0,  ByteArray{}, "", State{0, 0, 0, 0, 0}, "", 0, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0,
          0,  "", 0,           0}
{
}